

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

void __thiscall
MutableS2ShapeIndex::InteriorTracker::RestoreStateBefore(InteriorTracker *this,int32 limit_shape_id)

{
  iterator __first;
  iterator __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  const_iterator local_48;
  int *local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  const_iterator local_30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  const_iterator local_20;
  int32 local_14;
  InteriorTracker *pIStack_10;
  int32 limit_shape_id_local;
  InteriorTracker *this_local;
  
  local_14 = limit_shape_id;
  pIStack_10 = this;
  local_28._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->shape_ids_);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_20,
             &local_28);
  local_38._M_current = (int *)lower_bound(this,local_14);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_30,
             &local_38);
  local_40 = (int *)std::vector<int,_std::allocator<int>_>::erase
                              (&this->shape_ids_,local_20,local_30);
  local_50._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->shape_ids_);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_48,
             &local_50);
  __first = std::vector<int,_std::allocator<int>_>::begin(&this->saved_ids_);
  __last = std::vector<int,_std::allocator<int>_>::end(&this->saved_ids_);
  std::vector<int,std::allocator<int>>::
  insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&this->shape_ids_,local_48,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current);
  std::vector<int,_std::allocator<int>_>::clear(&this->saved_ids_);
  return;
}

Assistant:

void MutableS2ShapeIndex::InteriorTracker::RestoreStateBefore(
    int32 limit_shape_id) {
  shape_ids_.erase(shape_ids_.begin(), lower_bound(limit_shape_id));
  shape_ids_.insert(shape_ids_.begin(), saved_ids_.begin(), saved_ids_.end());
  saved_ids_.clear();
}